

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# siphash.h
# Opt level: O0

siphash * sip24_update(siphash *H,void *src,size_t len)

{
  uchar uVar1;
  uchar *puVar2;
  ulong uVar3;
  bool bVar4;
  uint64_t m;
  uchar *pe;
  uchar *p;
  size_t len_local;
  void *src_local;
  siphash *H_local;
  
  pe = (uchar *)src;
  while( true ) {
    while( true ) {
      bVar4 = false;
      if (pe < (uchar *)((long)src + len)) {
        bVar4 = H->p < &H->p;
      }
      if (!bVar4) break;
      uVar1 = *pe;
      puVar2 = H->p;
      H->p = puVar2 + 1;
      *puVar2 = uVar1;
      pe = pe + 1;
    }
    if (H->p < &H->p) break;
    uVar3 = *(ulong *)H->buf;
    H->v3 = uVar3 ^ H->v3;
    sip_round(H,2);
    H->v0 = uVar3 ^ H->v0;
    H->p = H->buf;
    H->c = H->c + 8;
    if ((uchar *)((long)src + len) <= pe) {
      return H;
    }
  }
  return H;
}

Assistant:

static struct siphash *sip24_update(struct siphash *H, const void *src,
		size_t len) {
	const unsigned char *p = (const unsigned char *)src, *pe = p + len;
	uint64_t m;

	do {
		while (p < pe && H->p < sip_endof(H->buf))
			*H->p++ = *p++;

		if (H->p < sip_endof(H->buf))
			break;

		m = SIP_U8TO64_LE(H->buf);
		H->v3 ^= m;
		sip_round(H, 2);
		H->v0 ^= m;

		H->p = H->buf;
		H->c += 8;
	} while (p < pe);

	return H;
}